

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerResults.cpp
# Opt level: O0

void __thiscall
MDIOAnalyzerResults::GenerateExportFile
          (MDIOAnalyzerResults *this,char *file,DisplayBase display_base,U32 param_3)

{
  ulonglong uVar1;
  undefined2 uVar2;
  U64 UVar3;
  byte bVar4;
  ostream *poVar5;
  char local_568 [8];
  char number_str_1 [128];
  Frame local_4c0 [40];
  char local_498 [8];
  char number_str2 [128];
  Frame local_410 [16];
  ulonglong local_400;
  undefined2 local_3f0;
  char local_3e8 [8];
  char number_str [128];
  Frame local_360 [40];
  Frame local_338 [16];
  ulonglong local_328;
  undefined2 local_318;
  int local_30c;
  char local_308 [8];
  char time_str [128];
  Frame frame;
  undefined2 local_268;
  U64 frame_id;
  U64 last_frame_id;
  U64 first_frame_id;
  ulong uStack_240;
  U32 packet_id;
  U64 num_packets;
  U32 sample_rate;
  ulonglong local_228;
  U64 trigger_sample;
  ofstream file_stream;
  U32 param_3_local;
  DisplayBase display_base_local;
  char *file_local;
  MDIOAnalyzerResults *this_local;
  
  std::ofstream::ofstream(&trigger_sample,file,_S_out);
  local_228 = Analyzer::GetTriggerSample();
  num_packets._0_4_ = Analyzer::GetSampleRate();
  poVar5 = std::operator<<((ostream *)&trigger_sample,
                           "Time [s],Packet ID,MDIOClause,OP,PHYADDR,REGADDR/DEVTYPE,ADDR/DATA");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  uStack_240 = AnalyzerResults::GetNumPackets();
  for (first_frame_id._4_4_ = 0; first_frame_id._4_4_ < uStack_240;
      first_frame_id._4_4_ = first_frame_id._4_4_ + 1) {
    AnalyzerResults::GetFramesContainedInPacket
              ((ulonglong)this,(ulonglong *)(ulong)first_frame_id._4_4_,&last_frame_id);
    UVar3 = last_frame_id;
    AnalyzerResults::GetFrame((ulonglong)(time_str + 0x78));
    AnalyzerHelpers::GetTimeString(time_str._120_8_,local_228,(uint)num_packets,local_308,0x80);
    poVar5 = std::operator<<((ostream *)&trigger_sample,local_308);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,first_frame_id._4_4_);
    std::operator<<(poVar5,",");
    if ((char)local_268 == '\0') {
      std::operator<<((ostream *)&trigger_sample,"22,");
    }
    else if ((char)local_268 == '\x01') {
      std::operator<<((ostream *)&trigger_sample,"45,");
    }
    else {
      std::operator<<((ostream *)&trigger_sample,",");
    }
    if (frame_id < UVar3 + 1) {
      local_30c = 4;
    }
    else {
      AnalyzerResults::GetFrame((ulonglong)local_338);
      uVar2 = local_318;
      uVar1 = local_328;
      local_268 = local_318;
      time_str[0x78] = (char)local_338[0];
      time_str[0x79] = (char)local_338[1];
      time_str[0x7a] = (char)local_338[2];
      time_str[0x7b] = (char)local_338[3];
      time_str[0x7c] = (char)local_338[4];
      time_str[0x7d] = (char)local_338[5];
      time_str[0x7e] = (char)local_338[6];
      time_str[0x7f] = (char)local_338[7];
      Frame::~Frame(local_338);
      local_268._0_1_ = (char)uVar2;
      switch((char)local_268) {
      case '\x02':
        std::operator<<((ostream *)&trigger_sample,"Write,");
        break;
      case '\x03':
        std::operator<<((ostream *)&trigger_sample,"Read,");
        break;
      case '\x04':
        std::operator<<((ostream *)&trigger_sample,"Address,");
        break;
      case '\x05':
        std::operator<<((ostream *)&trigger_sample,"Read +Addr,");
        break;
      default:
        std::operator<<((ostream *)&trigger_sample,",");
      }
      local_268 = uVar2;
      if (frame_id < UVar3 + 2) {
        local_30c = 4;
      }
      else {
        AnalyzerResults::GetFrame((ulonglong)local_360);
        memcpy(time_str + 0x78,local_360,0x22);
        Frame::~Frame(local_360);
        if ((char)local_268 != '\x06') {
          std::operator<<((ostream *)&trigger_sample,",");
        }
        AnalyzerHelpers::GetNumberString(uVar1,display_base,5,local_3e8,0x80);
        poVar5 = std::operator<<((ostream *)&trigger_sample,local_3e8);
        std::operator<<(poVar5,",");
        if (frame_id < UVar3 + 3) {
          local_30c = 4;
        }
        else {
          AnalyzerResults::GetFrame((ulonglong)local_410);
          uVar2 = local_3f0;
          uVar1 = local_400;
          local_268 = local_3f0;
          time_str[0x78] = (char)local_410[0];
          time_str[0x79] = (char)local_410[1];
          time_str[0x7a] = (char)local_410[2];
          time_str[0x7b] = (char)local_410[3];
          time_str[0x7c] = (char)local_410[4];
          time_str[0x7d] = (char)local_410[5];
          time_str[0x7e] = (char)local_410[6];
          time_str[0x7f] = (char)local_410[7];
          Frame::~Frame(local_410);
          AnalyzerHelpers::GetNumberString(uVar1,display_base,5,local_498,0x80);
          local_268._0_1_ = (char)uVar2;
          switch((char)local_268) {
          case '\a':
            poVar5 = std::operator<<((ostream *)&trigger_sample,local_498);
            std::operator<<(poVar5,",");
            break;
          case '\b':
            poVar5 = std::operator<<((ostream *)&trigger_sample,local_498);
            std::operator<<(poVar5,"(Reserved),");
            break;
          case '\t':
            poVar5 = std::operator<<((ostream *)&trigger_sample,local_498);
            std::operator<<(poVar5,"(PMD/PMA),");
            break;
          case '\n':
            poVar5 = std::operator<<((ostream *)&trigger_sample,local_498);
            std::operator<<(poVar5,"(WIS),");
            break;
          case '\v':
            poVar5 = std::operator<<((ostream *)&trigger_sample,local_498);
            std::operator<<(poVar5,"(PCS),");
            break;
          case '\f':
            poVar5 = std::operator<<((ostream *)&trigger_sample,local_498);
            std::operator<<(poVar5,"(PHY XS),");
            break;
          case '\r':
            poVar5 = std::operator<<((ostream *)&trigger_sample,local_498);
            std::operator<<(poVar5,"(DTE XS),");
            break;
          case '\x0e':
            poVar5 = std::operator<<((ostream *)&trigger_sample,local_498);
            std::operator<<(poVar5,"(Other),");
            break;
          default:
            std::operator<<((ostream *)&trigger_sample,",");
          }
          local_268 = uVar2;
          if (frame_id < UVar3 + 4) {
            local_30c = 4;
          }
          else {
            AnalyzerResults::GetFrame((ulonglong)local_4c0);
            memcpy(time_str + 0x78,local_4c0,0x22);
            Frame::~Frame(local_4c0);
            if ((char)local_268 != '\x0f') {
              std::operator<<((ostream *)&trigger_sample,",");
            }
            if (frame_id < UVar3 + 5) {
              local_30c = 4;
            }
            else {
              AnalyzerResults::GetFrame((ulonglong)(number_str_1 + 0x78));
              memcpy(time_str + 0x78,number_str_1 + 0x78,0x22);
              Frame::~Frame((Frame *)(number_str_1 + 0x78));
              if ((((char)local_268 == '\x10') || ((char)local_268 == '\x11')) ||
                 ((char)local_268 == '\x12')) {
                AnalyzerHelpers::GetNumberString(uVar1,display_base,0x10,local_568,0x80);
                std::operator<<((ostream *)&trigger_sample,local_568);
              }
              else {
                std::operator<<((ostream *)&trigger_sample,",");
              }
              std::ostream::operator<<
                        ((ostream *)&trigger_sample,std::endl<char,std::char_traits<char>>);
              bVar4 = AnalyzerResults::UpdateExportProgressAndCheckForCancel
                                ((ulonglong)this,(ulong)first_frame_id._4_4_);
              if ((bVar4 & 1) == 0) {
                local_30c = 0;
              }
              else {
                local_30c = 1;
              }
            }
          }
        }
      }
    }
    Frame::~Frame((Frame *)(time_str + 0x78));
    if ((local_30c != 0) && (local_30c != 4)) goto LAB_0010b787;
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uStack_240);
  local_30c = 0;
LAB_0010b787:
  std::ofstream::~ofstream(&trigger_sample);
  return;
}

Assistant:

void MDIOAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 /*export_type_user_id*/ )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    file_stream << "Time [s],Packet ID,MDIOClause,OP,PHYADDR,REGADDR/DEVTYPE,ADDR/DATA" << std::endl;

    U64 num_packets = GetNumPackets();

    for( U32 packet_id = 0; packet_id < num_packets; ++packet_id )
    {
        // get the frames contained in packet with index packet_id
        U64 first_frame_id;
        U64 last_frame_id;
        GetFramesContainedInPacket( packet_id, &first_frame_id, &last_frame_id );

        U64 frame_id = first_frame_id;

        // get MDIO_START frame to get the MDIOClause column value
        Frame frame = GetFrame( frame_id );

        char time_str[ 128 ];
        AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

        // Time [s] and Packet ID column
        file_stream << time_str << "," << packet_id << ",";

        if( frame.mType == MDIO_C22_START )
        {
            file_stream << "22,";
        }
        else if( frame.mType == MDIO_C45_START )
        {
            file_stream << "45,";
        }
        else
        {
            file_stream << ",";
        }

        ++frame_id;

        if( frame_id > last_frame_id )
        {
            continue;
        }

        // OP frame
        frame = GetFrame( frame_id );

        switch( frame.mType )
        {
        case MDIO_OP_W:
            file_stream << "Write,";
            break;
        case MDIO_OP_R:
            file_stream << "Read,";
            break;
        case MDIO_C45_OP_ADDR:
            file_stream << "Address,";
            break;
        case MDIO_C45_OP_READ_INC_ADDR:
            file_stream << "Read +Addr,";
            break;
        default:
            file_stream << ",";
            break;
        }

        ++frame_id;

        if( frame_id > last_frame_id )
        {
            continue;
        }

        // PHYADDR frame
        frame = GetFrame( frame_id );

        if( frame.mType != MDIO_PHYADDR )
        {
            file_stream << ",";
        }

        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );

        file_stream << number_str << ",";

        ++frame_id;

        if( frame_id > last_frame_id )
        {
            continue;
        }

        // REGADR or DEVTYPE frame
        frame = GetFrame( frame_id );

        char number_str2[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str2, 128 );

        switch( frame.mType )
        {
        case MDIO_C22_REGADDR:
            file_stream << number_str2 << ",";
            break;
        case MDIO_C45_DEVTYPE_RESERVED:
            file_stream << number_str2 << "(Reserved),";
            break;
        case MDIO_C45_DEVTYPE_PMD_PMA:
            file_stream << number_str2 << "(PMD/PMA),";
            break;
        case MDIO_C45_DEVTYPE_WIS:
            file_stream << number_str2 << "(WIS),";
            break;
        case MDIO_C45_DEVTYPE_PCS:
            file_stream << number_str2 << "(PCS),";
            break;
        case MDIO_C45_DEVTYPE_PHY_XS:
            file_stream << number_str2 << "(PHY XS),";
            break;
        case MDIO_C45_DEVTYPE_DTE_XS:
            file_stream << number_str2 << "(DTE XS),";
            break;
        case MDIO_C45_DEVTYPE_OTHER:
            file_stream << number_str2 << "(Other),";
            break;
        default:
            file_stream << ",";
        }

        ++frame_id;
        if( frame_id > last_frame_id )
        {
            continue;
        }

        // TA frame
        frame = GetFrame( frame_id );

        if( frame.mType != MDIO_TA )
        {
            file_stream << ",";
        }

        ++frame_id;
        if( frame_id > last_frame_id )
        {
            continue;
        }

        // MDIO_C22_DATA or MDIO_C45_ADDRDATA frame
        frame = GetFrame( frame_id );

        if( frame.mType == MDIO_C22_DATA || frame.mType == MDIO_C45_ADDR || frame.mType == MDIO_C45_DATA )
        {
            char number_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );
            file_stream << number_str;
        }
        else
        {
            file_stream << ",";
        }

        file_stream << std::endl;

        // check for cancel and update progress
        if( UpdateExportProgressAndCheckForCancel( packet_id, num_packets ) )
        {
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( num_packets, num_packets );
}